

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::CategoricalCrossEntropyLossLayer::ByteSizeLong
          (CategoricalCrossEntropyLossLayer *this)

{
  int iVar1;
  long lVar2;
  string *psVar3;
  size_t sVar4;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  CategoricalCrossEntropyLossLayer *this_local;
  
  sStack_18 = 0;
  input_abi_cxx11_(this);
  lVar2 = std::__cxx11::string::size();
  if (lVar2 != 0) {
    psVar3 = input_abi_cxx11_(this);
    sStack_18 = google::protobuf::internal::WireFormatLite::StringSize(psVar3);
    sStack_18 = sStack_18 + 1;
  }
  target_abi_cxx11_(this);
  lVar2 = std::__cxx11::string::size();
  if (lVar2 != 0) {
    psVar3 = target_abi_cxx11_(this);
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar3);
    sStack_18 = sVar4 + 1 + sStack_18;
  }
  iVar1 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar1;
  return sStack_18;
}

Assistant:

size_t CategoricalCrossEntropyLossLayer::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.CategoricalCrossEntropyLossLayer)
  size_t total_size = 0;

  // string input = 1;
  if (this->input().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->input());
  }

  // string target = 2;
  if (this->target().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->target());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}